

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O2

int x25519_priv_encode(CBB *out,EVP_PKEY *pkey)

{
  void *pvVar1;
  int iVar2;
  int line;
  CBB pkcs8;
  CBB inner;
  CBB private_key;
  CBB algorithm;
  
  pvVar1 = pkey->pkey;
  if (*(char *)((long)pvVar1 + 0x40) == '\0') {
    iVar2 = 0x82;
    line = 0xba;
  }
  else {
    iVar2 = CBB_add_asn1(out,&pkcs8,0x20000010);
    if (((((iVar2 != 0) && (iVar2 = CBB_add_asn1_uint64(&pkcs8,0), iVar2 != 0)) &&
         (iVar2 = CBB_add_asn1(&pkcs8,&algorithm,0x20000010), iVar2 != 0)) &&
        ((iVar2 = CBB_add_asn1_element(&algorithm,6,x25519_asn1_meth.oid,3), iVar2 != 0 &&
         (iVar2 = CBB_add_asn1(&pkcs8,&private_key,4), iVar2 != 0)))) &&
       ((iVar2 = CBB_add_asn1(&private_key,&inner,4), iVar2 != 0 &&
        ((iVar2 = CBB_add_bytes(&inner,(uint8_t *)((long)pvVar1 + 0x20),0x20), iVar2 != 0 &&
         (iVar2 = CBB_flush(out), iVar2 != 0)))))) {
      return 1;
    }
    iVar2 = 0x69;
    line = 0xcb;
  }
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                ,line);
  return 0;
}

Assistant:

static int x25519_priv_encode(CBB *out, const EVP_PKEY *pkey) {
  const X25519_KEY *key = reinterpret_cast<const X25519_KEY *>(pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  // See RFC 8410, section 7.
  CBB pkcs8, algorithm, private_key, inner;
  if (!CBB_add_asn1(out, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pkcs8, 0 /* version */) ||
      !CBB_add_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, x25519_asn1_meth.oid,
                            x25519_asn1_meth.oid_len) ||
      !CBB_add_asn1(&pkcs8, &private_key, CBS_ASN1_OCTETSTRING) ||
      !CBB_add_asn1(&private_key, &inner, CBS_ASN1_OCTETSTRING) ||
      // The PKCS#8 encoding stores only the 32-byte seed which is the first 32
      // bytes of the private key.
      !CBB_add_bytes(&inner, key->priv, 32) ||  //
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}